

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# await.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  char *result;
  
  pcVar1 = all_tests();
  if (pcVar1 == (char *)0x0) {
    printf(
          "/workspace/llm4binary/github/license_all_cmakelists_25/Gor027[P]Thread_Pool/test/await.c ALL TESTS PASSED\n"
          );
  }
  else {
    printf("/workspace/llm4binary/github/license_all_cmakelists_25/Gor027[P]Thread_Pool/test/await.c %s\n"
           ,pcVar1);
  }
  printf("/workspace/llm4binary/github/license_all_cmakelists_25/Gor027[P]Thread_Pool/test/await.c Tests run: %d\n"
         ,(ulong)(uint)tests_run);
  return (int)(pcVar1 != (char *)0x0);
}

Assistant:

int main() {
  char *result = all_tests();
  if (result != 0) {
    printf(__FILE__ " %s\n", result);
  } else {
    printf(__FILE__ " ALL TESTS PASSED\n");
  }
  printf(__FILE__ " Tests run: %d\n", tests_run);

  return result != 0;
}